

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.c
# Opt level: O1

int64_t decNumberIntegralToInt64(decNumber_conflict *dn,decContext *set)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  uint64_t prev;
  ulong uVar4;
  ulong uVar5;
  uint16_t *puVar6;
  ulong uVar7;
  long lVar8;
  
  if ((dn->bits & 0x70) == 0) {
    iVar1 = dn->exponent;
    if (-1 < (long)iVar1) {
      iVar2 = dn->digits;
      if (iVar2 + iVar1 < 0x14) {
        if (iVar2 < 1) {
          uVar7 = 0;
        }
        else {
          puVar6 = dn->lsu;
          lVar8 = 1;
          bVar3 = false;
          uVar4 = 0;
          do {
            uVar7 = (ulong)*puVar6 * *(long *)(&DAT_00dba338 + lVar8 * 8) + uVar4;
            if (uVar7 < uVar4) goto LAB_00b271d6;
            if ((long)uVar7 < 0) goto LAB_00b271e6;
            puVar6 = puVar6 + 1;
            lVar8 = lVar8 + 3;
            uVar4 = uVar7;
          } while (lVar8 <= iVar2);
        }
        uVar5 = DECPOWERS[iVar1] * uVar7;
        uVar4 = CONCAT71(0xdba3,uVar5 < uVar7);
        if ((long)uVar5 < 0 || uVar5 < uVar7) {
LAB_00b271d6:
          bVar3 = false;
        }
        else {
          uVar4 = -uVar5;
          if (-1 < (char)dn->bits) {
            uVar4 = uVar5;
          }
          bVar3 = true;
        }
LAB_00b271e6:
        if (bVar3) {
          return uVar4;
        }
      }
    }
  }
  decContextSetStatus(set,0x80);
  return 0;
}

Assistant:

int64_t decNumberIntegralToInt64(const decNumber *dn, decContext *set)
{
    if (decNumberIsSpecial(dn) || (dn->exponent < 0) ||
       (dn->digits + dn->exponent > 19)) {
        goto Invalid;
    } else {
        int64_t d;        /* work */
        const Unit *up;   /* .. */
        uint64_t hi = 0;
        up = dn->lsu;     /* -> lsu */

        for (d = 1; d <= dn->digits; up++, d += DECDPUN) {
            uint64_t prev = hi;
            hi += *up * powers[d-1];
            if ((hi < prev) || (hi > INT64_MAX)) {
                goto Invalid;
            }
        }

        uint64_t prev = hi;
        hi *= (uint64_t)powers[dn->exponent];
        if ((hi < prev) || (hi > INT64_MAX)) {
            goto Invalid;
        }
        return (decNumberIsNegative(dn)) ? -((int64_t)hi) : (int64_t)hi;
    }

Invalid:
    decContextSetStatus(set, DEC_Invalid_operation);
    return 0;
}